

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O3

void __thiscall iDynTree::SubModelDecomposition::~SubModelDecomposition(SubModelDecomposition *this)

{
  pointer puVar1;
  pointer ppTVar2;
  
  setNrOfSubModels(this,0);
  puVar1 = (this->link2subModelIndex).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->link2subModelIndex).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  ppTVar2 = (this->subModelTraversals).
            super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->subModelTraversals).
                                  super__Vector_base<iDynTree::Traversal_*,_std::allocator<iDynTree::Traversal_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2
                   );
    return;
  }
  return;
}

Assistant:

SubModelDecomposition::~SubModelDecomposition()
{
    this->setNrOfSubModels(0);
}